

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O0

int32_t ulocimp_getRegionForSupplementalData_63
                  (char *localeID,UBool inferRegion,char *region,int32_t regionCapacity,
                  UErrorCode *status)

{
  UBool UVar1;
  char cVar2;
  int iVar3;
  char local_f8 [8];
  char locBuf [157];
  int32_t *local_50;
  char *rgPtr;
  int32_t rgLen;
  UErrorCode rgStatus;
  char rgBuf [8];
  UErrorCode *status_local;
  int32_t regionCapacity_local;
  char *region_local;
  UBool inferRegion_local;
  char *localeID_local;
  
  rgBuf = (char  [8])status;
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    rgPtr._4_4_ = U_ZERO_ERROR;
    rgPtr._0_4_ = uloc_getKeywordValue_63
                            (localeID,"rg",(char *)&rgLen,8,(UErrorCode *)((long)&rgPtr + 4));
    UVar1 = U_FAILURE(rgPtr._4_4_);
    if ((UVar1 == '\0') && ((int32_t)rgPtr == 6)) {
      for (local_50 = &rgLen; (char)*local_50 != '\0'; local_50 = (int32_t *)((long)local_50 + 1)) {
        cVar2 = uprv_toupper_63((char)*local_50);
        *(char *)local_50 = cVar2;
      }
      iVar3 = strcmp((char *)((long)&rgLen + 2),"ZZZZ");
      rgPtr._0_4_ = 0;
      if (iVar3 == 0) {
        rgPtr._0_4_ = 2;
      }
    }
    else {
      rgPtr._0_4_ = 0;
    }
    if ((int32_t)rgPtr == 0) {
      rgPtr._0_4_ = uloc_getCountry_63(localeID,(char *)&rgLen,8,(UErrorCode *)rgBuf);
      UVar1 = U_FAILURE(*(UErrorCode *)rgBuf);
      if (UVar1 == '\0') {
        if (((int32_t)rgPtr == 0) && (inferRegion != '\0')) {
          rgPtr._4_4_ = U_ZERO_ERROR;
          uloc_addLikelySubtags_63(localeID,local_f8,0x9d,(UErrorCode *)((long)&rgPtr + 4));
          UVar1 = U_SUCCESS(rgPtr._4_4_);
          if (UVar1 != '\0') {
            rgPtr._0_4_ = uloc_getCountry_63(local_f8,(char *)&rgLen,8,(UErrorCode *)rgBuf);
            UVar1 = U_FAILURE(*(UErrorCode *)rgBuf);
            if (UVar1 != '\0') {
              rgPtr._0_4_ = 0;
            }
          }
        }
      }
      else {
        rgPtr._0_4_ = 0;
      }
    }
    *(undefined1 *)((long)&rgLen + (long)(int32_t)rgPtr) = 0;
    strncpy(region,(char *)&rgLen,(long)regionCapacity);
    localeID_local._4_4_ =
         u_terminateChars_63(region,regionCapacity,(int32_t)rgPtr,(UErrorCode *)rgBuf);
  }
  else {
    localeID_local._4_4_ = 0;
  }
  return localeID_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ulocimp_getRegionForSupplementalData(const char *localeID, UBool inferRegion,
                                     char *region, int32_t regionCapacity, UErrorCode* status) {
    if (U_FAILURE(*status)) {
        return 0;
    }
    char rgBuf[ULOC_RG_BUFLEN];
    UErrorCode rgStatus = U_ZERO_ERROR;

    // First check for rg keyword value
    int32_t rgLen = uloc_getKeywordValue(localeID, "rg", rgBuf, ULOC_RG_BUFLEN, &rgStatus);
    if (U_FAILURE(rgStatus) || rgLen != 6) {
        rgLen = 0;
    } else {
        // rgBuf guaranteed to be zero terminated here, with text len 6
        char *rgPtr = rgBuf;
        for (; *rgPtr!= 0; rgPtr++) {
            *rgPtr = uprv_toupper(*rgPtr);
        }
        rgLen = (uprv_strcmp(rgBuf+2, "ZZZZ") == 0)? 2: 0;
    }

    if (rgLen == 0) {
        // No valid rg keyword value, try for unicode_region_subtag
        rgLen = uloc_getCountry(localeID, rgBuf, ULOC_RG_BUFLEN, status);
        if (U_FAILURE(*status)) {
            rgLen = 0;
        } else if (rgLen == 0 && inferRegion) {
            // no unicode_region_subtag but inferRegion TRUE, try likely subtags
            char locBuf[ULOC_FULLNAME_CAPACITY];
            rgStatus = U_ZERO_ERROR;
            (void)uloc_addLikelySubtags(localeID, locBuf, ULOC_FULLNAME_CAPACITY, &rgStatus);
            if (U_SUCCESS(rgStatus)) {
                rgLen = uloc_getCountry(locBuf, rgBuf, ULOC_RG_BUFLEN, status);
                if (U_FAILURE(*status)) {
                    rgLen = 0;
                }
            }
        }
    }

    rgBuf[rgLen] = 0;
    uprv_strncpy(region, rgBuf, regionCapacity);
    return u_terminateChars(region, regionCapacity, rgLen, status);
}